

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

istream * operator>>(istream *in,Matrix *matrix)

{
  int iVar1;
  istream *this;
  Fraction *f;
  int iVar2;
  int i;
  int j;
  int m;
  int n;
  int local_70;
  int local_6c;
  Matrix local_68;
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  local_48;
  
  this = (istream *)std::istream::operator>>((istream *)in,&local_6c);
  std::istream::operator>>(this,&local_70);
  i = 0;
  Matrix::Matrix(&local_68,local_6c,local_70,0);
  matrix->n_ = local_68.n_;
  matrix->m_ = local_68.m_;
  local_48.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (matrix->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (matrix->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.elements_.
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (matrix->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (matrix->elements_).
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (matrix->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.elements_.
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (matrix->elements_).
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.elements_.
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_68.elements_);
  iVar2 = local_6c;
  iVar1 = local_70;
  if (0 < local_6c) {
    do {
      if (0 < iVar1) {
        j = 0;
        do {
          f = Matrix::At(matrix,i,j);
          operator>>(in,f);
          j = j + 1;
          iVar2 = local_6c;
          iVar1 = local_70;
        } while (j < local_70);
      }
      i = i + 1;
    } while (i < iVar2);
  }
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, Matrix& matrix) {
  int n, m;
  in >> n >> m;

  matrix = Matrix(n, m);
  for (int i = 0; i < n; ++i) {
    for (int j = 0; j < m; ++j) {
      in >> matrix.At(i, j);
    }
  }

  return in;
}